

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_InputsOnlyFromDescriptorSetIn_UnusedImportIsNotReported_Test::
CommandLineInterfaceTest_InputsOnlyFromDescriptorSetIn_UnusedImportIsNotReported_Test
          (CommandLineInterfaceTest_InputsOnlyFromDescriptorSetIn_UnusedImportIsNotReported_Test
           *this)

{
  CommandLineInterfaceTest_InputsOnlyFromDescriptorSetIn_UnusedImportIsNotReported_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)
       &
       PTR__CommandLineInterfaceTest_InputsOnlyFromDescriptorSetIn_UnusedImportIsNotReported_Test_029f91e0
  ;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       InputsOnlyFromDescriptorSetIn_UnusedImportIsNotReported) {
  FileDescriptorSet file_descriptor_set;

  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("unused.proto");
  file_descriptor_proto->add_message_type()->set_name("Unused");

  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("bar.proto");
  file_descriptor_proto->add_dependency("unused.proto");
  file_descriptor_proto->add_message_type()->set_name("Bar");

  WriteDescriptorSet("unused_and_bar.bin", &file_descriptor_set);

  Run("protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir "
      "--descriptor_set_in=$tmpdir/unused_and_bar.bin unused.proto bar.proto");
  ExpectNoErrors();
}